

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O3

void __thiscall CMU462::DynamicScene::XFormWidget::drawScaleHandles(XFormWidget *this)

{
  double *pdVar1;
  pointer pVVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  Vector3D c;
  double local_188;
  double dStack_180;
  double local_178;
  undefined1 local_168 [16];
  double local_158;
  undefined8 uStack_150;
  XFormWidget *local_140;
  double local_138;
  double dStack_130;
  double local_128;
  double local_118;
  double dStack_110;
  double local_108;
  double local_f8;
  double dStack_f0;
  double local_e8;
  double local_d8;
  double dStack_d0;
  double local_c8;
  double local_b8;
  double dStack_b0;
  double local_a8;
  double local_98;
  double dStack_90;
  double local_88;
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  double local_58;
  double local_48;
  double dStack_40;
  double local_38;
  
  if ((this->target).object != (SceneObject *)0x0) {
    local_118 = (this->center).x;
    dStack_110 = (this->center).y;
    local_108 = (this->center).z;
    dVar9 = (this->bounds).max.x - (this->bounds).min.x;
    dVar8 = (this->bounds).max.y - (this->bounds).min.y;
    dVar10 = (this->bounds).max.z - (this->bounds).min.z;
    dVar9 = SQRT(dVar10 * dVar10 + dVar9 * dVar9 + dVar8 * dVar8) * 0.5;
    glLineWidth(0x41000000);
    glBegin(1);
    local_158 = dVar9 * 0.9;
    uStack_150 = 0;
    local_168._8_4_ = SUB84(local_158,0);
    local_168._0_8_ = local_158;
    local_168._12_4_ = (int)((ulong)local_158 >> 0x20);
    lVar7 = 0;
    do {
      pVVar2 = (this->axes).super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_178 = *(double *)((long)&pVVar2->z + lVar7) * local_158 + local_108;
      pdVar1 = (double *)((long)&pVVar2->x + lVar7);
      local_188 = *pdVar1 * (double)local_168._0_8_ + local_118;
      dStack_180 = pdVar1[1] * (double)local_168._8_8_ + dStack_110;
      glColor4ubv(*(undefined8 *)
                   ((long)&(((this->axisColors).
                             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data + lVar7));
      glVertex3dv(&local_118);
      glVertex3dv(&local_188);
      lVar7 = lVar7 + 0x18;
    } while (lVar7 != 0x48);
    glEnd();
    glBegin(7);
    local_158 = dVar9 * 0.8;
    dVar9 = dVar9 * 0.5 * 0.2;
    uStack_150 = 0;
    local_168._8_4_ = SUB84(local_158,0);
    local_168._0_8_ = local_158;
    local_168._12_4_ = (int)((ulong)local_158 >> 0x20);
    lVar7 = 0;
    local_140 = this;
    local_78 = dVar9;
    dStack_70 = dVar9;
    do {
      glColor4ubv(*(undefined8 *)
                   ((long)&(((this->axisColors).
                             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data + lVar7));
      pVVar2 = (this->axes).super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_58 = *(double *)((long)&pVVar2->z + lVar7) * local_158 + local_108;
      pdVar1 = (double *)((long)&pVVar2->x + lVar7);
      local_68 = *pdVar1 * (double)local_168._0_8_ + local_118;
      dStack_60 = pdVar1[1] * (double)local_168._8_8_ + dStack_110;
      dVar3 = pVVar2[1].x;
      dVar4 = pVVar2[1].y;
      dVar8 = pVVar2[1].z;
      dVar5 = pVVar2[2].x;
      dVar6 = pVVar2[2].y;
      dVar10 = pVVar2[2].z;
      local_188 = ((pVVar2->x - dVar3) - dVar5) * local_78 + local_68;
      dStack_180 = ((pVVar2->y - dVar4) - dVar6) * dStack_70 + dStack_60;
      local_178 = ((pVVar2->z - dVar8) - dVar10) * dVar9 + local_58;
      local_88 = ((pVVar2->z - dVar8) + dVar10) * dVar9 + local_58;
      local_98 = ((pVVar2->x - dVar3) + dVar5) * local_78 + local_68;
      dStack_90 = ((pVVar2->y - dVar4) + dVar6) * dStack_70 + dStack_60;
      local_a8 = ((pVVar2->z + dVar8) - dVar10) * dVar9 + local_58;
      local_b8 = ((pVVar2->x + dVar3) - dVar5) * local_78 + local_68;
      dStack_b0 = ((pVVar2->y + dVar4) - dVar6) * dStack_70 + dStack_60;
      local_128 = (pVVar2->z + dVar8 + dVar10) * dVar9 + local_58;
      local_138 = (pVVar2->x + dVar3 + dVar5) * local_78 + local_68;
      dStack_130 = (pVVar2->y + dVar4 + dVar6) * dStack_70 + dStack_60;
      local_c8 = ((-pVVar2->z - dVar8) - dVar10) * dVar9 + local_58;
      local_d8 = ((-pVVar2->x - dVar3) - dVar5) * local_78 + local_68;
      dStack_d0 = ((-pVVar2->y - dVar4) - dVar6) * dStack_70 + dStack_60;
      local_38 = ((-pVVar2->z - dVar8) + dVar10) * dVar9 + local_58;
      local_48 = ((-pVVar2->x - dVar3) + dVar5) * local_78 + local_68;
      dStack_40 = ((-pVVar2->y - dVar4) + dVar6) * dStack_70 + dStack_60;
      local_e8 = ((dVar8 - pVVar2->z) - dVar10) * dVar9 + local_58;
      local_f8 = ((dVar3 - pVVar2->x) - dVar5) * local_78 + local_68;
      dStack_f0 = ((dVar4 - pVVar2->y) - dVar6) * dStack_70 + dStack_60;
      local_58 = ((dVar8 - pVVar2->z) + dVar10) * dVar9 + local_58;
      local_68 = ((dVar3 - pVVar2->x) + dVar5) * local_78 + local_68;
      dStack_60 = ((dVar4 - pVVar2->y) + dVar6) * dStack_70 + dStack_60;
      glVertex3dv(&local_188);
      glVertex3dv(&local_98);
      glVertex3dv(&local_138);
      glVertex3dv(&local_b8);
      glVertex3dv(&local_d8);
      glVertex3dv(&local_48);
      glVertex3dv(&local_68);
      glVertex3dv(&local_f8);
      glVertex3dv(&local_188);
      glVertex3dv(&local_b8);
      glVertex3dv(&local_f8);
      glVertex3dv(&local_d8);
      glVertex3dv(&local_98);
      glVertex3dv(&local_138);
      glVertex3dv(&local_68);
      glVertex3dv(&local_48);
      glVertex3dv(&local_188);
      this = local_140;
      glVertex3dv(&local_d8);
      glVertex3dv(&local_48);
      glVertex3dv(&local_98);
      glVertex3dv(&local_b8);
      glVertex3dv(&local_f8);
      glVertex3dv(&local_68);
      glVertex3dv(&local_138);
      lVar7 = lVar7 + 0x18;
    } while (lVar7 != 0x48);
    glEnd();
    drawCenterHandle(this);
    glLineWidth(0x3f800000);
  }
  return;
}

Assistant:

void XFormWidget::drawScaleHandles() const {
  const double boxSize = .2;

  if (target.object == nullptr) return;

  Vector3D c = center;
  double r = (bounds.max - bounds.min).norm() / 2.;

  // Draw arrow stems
  glLineWidth(8.);
  glBegin(GL_LINES);
  for (int i = 0; i < 3; i++) {
    Vector3D b = c + (1. - boxSize / 2.) * r * axes[i];

    glColor4ubv(&axisColors[i][0]);

    glVertex3dv(&c.x);
    glVertex3dv(&b.x);
  }
  glEnd();

  // Draw box heads
  glBegin(GL_QUADS);
  for (int i = 0; i < 3; i++) {
    glColor4ubv(&axisColors[i][0]);
    Vector3D q = c + r * (1. - boxSize) * axes[i];
    Vector3D q000 = q + .5 * r * boxSize * (axes[0] - axes[1] - axes[2]);
    Vector3D q001 = q + .5 * r * boxSize * (axes[0] - axes[1] + axes[2]);
    Vector3D q010 = q + .5 * r * boxSize * (axes[0] + axes[1] - axes[2]);
    Vector3D q011 = q + .5 * r * boxSize * (axes[0] + axes[1] + axes[2]);
    Vector3D q100 = q + .5 * r * boxSize * (-axes[0] - axes[1] - axes[2]);
    Vector3D q101 = q + .5 * r * boxSize * (-axes[0] - axes[1] + axes[2]);
    Vector3D q110 = q + .5 * r * boxSize * (-axes[0] + axes[1] - axes[2]);
    Vector3D q111 = q + .5 * r * boxSize * (-axes[0] + axes[1] + axes[2]);

    glVertex3dv(&q000.x);
    glVertex3dv(&q001.x);
    glVertex3dv(&q011.x);
    glVertex3dv(&q010.x);
    glVertex3dv(&q100.x);
    glVertex3dv(&q101.x);
    glVertex3dv(&q111.x);
    glVertex3dv(&q110.x);
    glVertex3dv(&q000.x);
    glVertex3dv(&q010.x);
    glVertex3dv(&q110.x);
    glVertex3dv(&q100.x);
    glVertex3dv(&q001.x);
    glVertex3dv(&q011.x);
    glVertex3dv(&q111.x);
    glVertex3dv(&q101.x);
    glVertex3dv(&q000.x);
    glVertex3dv(&q100.x);
    glVertex3dv(&q101.x);
    glVertex3dv(&q001.x);
    glVertex3dv(&q010.x);
    glVertex3dv(&q110.x);
    glVertex3dv(&q111.x);
    glVertex3dv(&q011.x);
  }
  glEnd();

  drawCenterHandle();

  glLineWidth(1.);
}